

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O3

bool __thiscall
glslang::TSymbolTableLevel::insertAnonymousMembers
          (TSymbolTableLevel *this,TSymbol *symbol,int firstMember)

{
  long lVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  long *plVar6;
  TPoolAllocator *this_00;
  undefined8 *puVar7;
  long lVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  byte bVar9;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
  *__args;
  ulong extraout_RDX;
  ulong uVar10;
  TPoolAllocator *local_60;
  undefined1 *local_58;
  undefined1 local_48 [16];
  undefined8 *local_38;
  
  iVar3 = (*symbol->_vptr_TSymbol[9])(symbol);
  plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x60))
                             ((long *)CONCAT44(extraout_var,iVar3));
  cVar2 = (**(code **)(*plVar6 + 0x128))(plVar6);
  if (cVar2 == '\0') {
    __assert_fail("isStruct()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                  ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
  }
  lVar1 = plVar6[0xd];
  uVar10 = (ulong)(uint)firstMember;
  bVar9 = 1;
  if (uVar10 < (ulong)(*(long *)(lVar1 + 0x10) - *(long *)(lVar1 + 8) >> 5)) {
    do {
      this_00 = GetThreadPoolAllocator();
      puVar7 = (undefined8 *)TPoolAllocator::allocate(this_00,0x40);
      lVar8 = (**(code **)(**(long **)(*(long *)(lVar1 + 8) + uVar10 * 0x20) + 0x30))();
      iVar3 = (*symbol->_vptr_TSymbol[9])(symbol);
      iVar4 = (*symbol->_vptr_TSymbol[9])(symbol);
      uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0xe8))
                        ((long *)CONCAT44(extraout_var_01,iVar4));
      puVar7[1] = lVar8;
      puVar7[2] = lVar8;
      puVar7[3] = 0;
      puVar7[4] = 0;
      *(undefined1 *)(puVar7 + 5) = 1;
      *puVar7 = &PTR_clone_009235f0;
      puVar7[6] = CONCAT44(extraout_var_00,iVar3);
      *(int *)(puVar7 + 7) = (int)uVar10;
      *(undefined4 *)((long)puVar7 + 0x3c) = uVar5;
      local_60 = GetThreadPoolAllocator();
      local_58 = local_48;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *
                          )&local_60,*(long *)(lVar8 + 8),
                          *(long *)(lVar8 + 0x10) + *(long *)(lVar8 + 8));
      local_38 = puVar7;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>,std::_Select1st<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>>
      ::
      _M_emplace_unique<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>const>
                ((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>,_bool>
                  *)this,(_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>,std::_Select1st<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>>
                          *)&local_60,__args);
      bVar9 = (byte)extraout_RDX;
      if ((extraout_RDX & 1) == 0) break;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (uVar10 < (ulong)(*(long *)(lVar1 + 0x10) - *(long *)(lVar1 + 8) >> 5));
  }
  return (bool)(bVar9 & 1);
}

Assistant:

bool insertAnonymousMembers(TSymbol& symbol, int firstMember)
    {
        const TTypeList& types = *symbol.getAsVariable()->getType().getStruct();
        for (unsigned int m = firstMember; m < types.size(); ++m) {
            TAnonMember* member = new TAnonMember(&types[m].type->getFieldName(), m, *symbol.getAsVariable(), symbol.getAsVariable()->getAnonId());
            if (! level.insert(tLevelPair(member->getMangledName(), member)).second)
                return false;
        }

        return true;
    }